

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inject_sleigh.cc
# Opt level: O1

int4 __thiscall
PcodeInjectLibrarySleigh::registerDynamicInject
          (PcodeInjectLibrarySleigh *this,InjectPayload *payload)

{
  pointer *pppIVar1;
  pointer ppIVar2;
  iterator __position;
  InjectPayload *local_18;
  
  ppIVar2 = (this->super_PcodeInjectLibrary).injection.
            super__Vector_base<InjectPayload_*,_std::allocator<InjectPayload_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  __position._M_current =
       (this->super_PcodeInjectLibrary).injection.
       super__Vector_base<InjectPayload_*,_std::allocator<InjectPayload_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->super_PcodeInjectLibrary).injection.
      super__Vector_base<InjectPayload_*,_std::allocator<InjectPayload_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_18 = payload;
    std::vector<InjectPayload*,std::allocator<InjectPayload*>>::
    _M_realloc_insert<InjectPayload*const&>
              ((vector<InjectPayload*,std::allocator<InjectPayload*>> *)
               &(this->super_PcodeInjectLibrary).injection,__position,&local_18);
  }
  else {
    *__position._M_current = payload;
    pppIVar1 = &(this->super_PcodeInjectLibrary).injection.
                super__Vector_base<InjectPayload_*,_std::allocator<InjectPayload_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppIVar1 = *pppIVar1 + 1;
  }
  return (int4)((ulong)((long)__position._M_current - (long)ppIVar2) >> 3);
}

Assistant:

int4 PcodeInjectLibrarySleigh::registerDynamicInject(InjectPayload *payload)

{
  int4 id = injection.size();
  injection.push_back(payload);
  return id;
}